

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O1

int jpc_enc_encpkt(jpc_enc_t *enc,jas_stream_t *out,int compno,int lvlno,int prcno,uint lyrno)

{
  uint value;
  jpc_enc_cp_t *pjVar1;
  jpc_enc_tile_t *pjVar2;
  jpc_enc_rlvl_t *pjVar3;
  jpc_enc_prc_t *pjVar4;
  jpc_tagtree_t *pjVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  jpc_bitstream_t *out_00;
  jpc_tagtreenode_t *pjVar15;
  jpc_ms_t *pjVar16;
  uint uVar17;
  jpc_enc_band_t *pjVar18;
  jpc_enc_pass_t *pjVar19;
  ulong uVar20;
  int iVar21;
  jpc_enc_band_t *pjVar22;
  jas_stream_t *pjVar23;
  undefined4 in_register_0000008c;
  long lVar24;
  jpc_enc_cblk_t *pjVar25;
  jpc_enc_pass_t *pjVar26;
  jpc_enc_cblk_t *pjVar27;
  jpc_enc_pass_t *pjVar28;
  bool bVar29;
  
  iVar10 = jas_getdbglevel();
  if (9 < iVar10) {
    jas_eprintf("encoding packet begin %d %d %d %d\n",(ulong)(uint)compno,(ulong)(uint)lvlno,
                (ulong)(uint)prcno,CONCAT44(in_register_0000008c,lyrno));
  }
  pjVar1 = enc->cp;
  pjVar2 = enc->curtile;
  if (((pjVar1->tcp).csty & 2) != 0) {
    pjVar16 = jpc_ms_create(0xff91);
    if (pjVar16 == (jpc_ms_t *)0x0) {
      return -1;
    }
    *(long *)&pjVar16->parms = (long)pjVar2->pi->pktno;
    iVar11 = jpc_putms(out,enc->cstate,pjVar16);
    if (iVar11 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar16);
  }
  out_00 = jpc_bitstream_sopen(out,"w+");
  if (out_00 == (jpc_bitstream_t *)0x0) {
    abort();
  }
  if ((out_00->openmode_ & 2) == 0) {
    __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                  ,0xd3,
                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)");
  }
  iVar21 = out_00->cnt_;
  iVar11 = iVar21 + -1;
  out_00->cnt_ = iVar11;
  if (iVar21 < 1) {
    uVar20 = out_00->buf_;
    pjVar23 = out_00->stream_;
    uVar8 = uVar20 & 0xff;
    uVar17 = uVar8 == 0xff ^ 7;
    out_00->cnt_ = uVar17;
    out_00->buf_ = (ulong)(uint)(1 << (sbyte)uVar17) | uVar8 << 8;
    uVar17 = pjVar23->flags_;
    if ((uVar17 & 7) == 0) {
      if ((pjVar23->rwlimit_ < 0) || (pjVar23->rwcnt_ < pjVar23->rwlimit_)) {
        *(byte *)&pjVar23->bufmode_ = (byte)pjVar23->bufmode_ | 0x20;
        iVar11 = pjVar23->cnt_;
        pjVar23->cnt_ = iVar11 + -1;
        bVar9 = (byte)uVar20;
        if (iVar11 < 1) {
          iVar11 = jas_stream_flushbuf(pjVar23,(uint)bVar9);
          if (iVar11 == -1) {
            return -1;
          }
        }
        else {
          pjVar23->rwcnt_ = pjVar23->rwcnt_ + 1;
          pbVar7 = pjVar23->ptr_;
          pjVar23->ptr_ = pbVar7 + 1;
          *pbVar7 = bVar9;
        }
        goto LAB_0012f714;
      }
LAB_001301fb:
      pjVar23->flags_ = uVar17 | 4;
    }
    return -1;
  }
  out_00->buf_ = out_00->buf_ | (long)(1 << ((byte)iVar11 & 0x1f));
LAB_0012f714:
  if (9 < iVar10) {
    jas_eprintf("present.\n");
  }
  pjVar3 = pjVar2->tcmpts[compno].rlvls;
  uVar20 = (ulong)pjVar3[lvlno].numbands;
  if (uVar20 != 0) {
    pjVar18 = pjVar3[lvlno].bands;
    pjVar22 = pjVar18 + uVar20;
    do {
      if (pjVar18->data != (jas_matrix_t *)0x0) {
        pjVar4 = pjVar18->prcs;
        pjVar25 = pjVar4[prcno].cblks;
        if (pjVar25 != (jpc_enc_cblk_t *)0x0) {
          uVar17 = pjVar4[prcno].numcblks;
          if ((ulong)uVar17 != 0) {
            lVar24 = 0;
            pjVar27 = pjVar25;
            do {
              if (lyrno == 0) {
                pjVar5 = pjVar4[prcno].nlibtree;
                pjVar15 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar27 -
                                                                  (long)pjVar4[prcno].cblks) >> 3) *
                                                     -0x3b13b13b);
                jpc_tagtree_setvalue(pjVar5,pjVar15,*(int *)((long)&pjVar25->numimsbs + lVar24));
              }
              lVar6 = *(long *)((long)&pjVar25->curpass + lVar24);
              if (((lVar6 != 0) && (value = *(uint *)(lVar6 + 0x20), value == lyrno)) &&
                 (*(int *)((long)&pjVar25->numencpasses + lVar24) == 0)) {
                pjVar5 = pjVar4[prcno].incltree;
                pjVar15 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar27 -
                                                                  (long)pjVar4[prcno].cblks) >> 3) *
                                                     -0x3b13b13b);
                jpc_tagtree_setvalue(pjVar5,pjVar15,value);
              }
              pjVar27 = pjVar27 + 1;
              lVar24 = lVar24 + 0x68;
            } while ((ulong)uVar17 * 0x68 - lVar24 != 0);
          }
          if ((ulong)pjVar4[prcno].numcblks != 0) {
            pjVar25 = pjVar4[prcno].cblks;
            pjVar27 = pjVar25 + pjVar4[prcno].numcblks;
            do {
              pjVar28 = pjVar25->curpass;
              if (pjVar28 == (jpc_enc_pass_t *)0x0) {
                bVar29 = false;
              }
              else {
                bVar29 = pjVar28->lyrno == lyrno;
              }
              if (pjVar25->numencpasses == 0) {
                pjVar5 = pjVar4[prcno].incltree;
                pjVar15 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar25 -
                                                                  (long)pjVar4[prcno].cblks) >> 3) *
                                                     -0x3b13b13b);
                iVar11 = jpc_tagtree_encode(pjVar5,pjVar15,lyrno + 1,out_00);
                if (iVar11 < 0) {
                  return -1;
                }
              }
              else {
                if ((out_00->openmode_ & 2) == 0) {
                  __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x101,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar21 = out_00->cnt_;
                iVar11 = iVar21 + -1;
                out_00->cnt_ = iVar11;
                if (iVar21 < 1) {
                  uVar20 = out_00->buf_;
                  pjVar23 = out_00->stream_;
                  uVar8 = uVar20 & 0xff;
                  uVar17 = uVar8 == 0xff ^ 7;
                  out_00->cnt_ = uVar17;
                  out_00->buf_ = (ulong)((uint)bVar29 << (sbyte)uVar17) | uVar8 << 8;
                  uVar17 = pjVar23->flags_;
                  if ((uVar17 & 7) != 0) {
                    return -1;
                  }
                  if ((-1 < pjVar23->rwlimit_) && (pjVar23->rwlimit_ <= pjVar23->rwcnt_))
                  goto LAB_001301fb;
                  *(byte *)&pjVar23->bufmode_ = (byte)pjVar23->bufmode_ | 0x20;
                  iVar11 = pjVar23->cnt_;
                  pjVar23->cnt_ = iVar11 + -1;
                  bVar9 = (byte)uVar20;
                  if (iVar11 < 1) {
                    iVar11 = jas_stream_flushbuf(pjVar23,(uint)bVar9);
                    if (iVar11 == -1) {
                      return -1;
                    }
                  }
                  else {
                    pjVar23->rwcnt_ = pjVar23->rwcnt_ + 1;
                    pbVar7 = pjVar23->ptr_;
                    pjVar23->ptr_ = pbVar7 + 1;
                    *pbVar7 = bVar9;
                  }
                }
                else {
                  out_00->buf_ = out_00->buf_ | (long)(int)((uint)bVar29 << ((byte)iVar11 & 0x1f));
                }
              }
              if (9 < iVar10) {
                jas_eprintf("included=%d ");
              }
              if (bVar29 != false) {
                if (pjVar25->numencpasses == 0) {
                  pjVar15 = jpc_tagtree_getleaf(pjVar4[prcno].nlibtree,
                                                (int)((ulong)((long)pjVar25 -
                                                             (long)pjVar4[prcno].cblks) >> 3) *
                                                -0x3b13b13b);
                  iVar11 = jpc_tagtree_encode(pjVar4[prcno].nlibtree,pjVar15,1,out_00);
                  if (iVar11 < 0) {
                    return -1;
                  }
                  iVar21 = 2;
                  while (iVar11 == 0) {
                    iVar11 = jpc_tagtree_encode(pjVar4[prcno].nlibtree,pjVar15,iVar21,out_00);
                    iVar21 = iVar21 + 1;
                    if (iVar11 < 0) {
                      return -1;
                    }
                  }
                  if ((pjVar15->known_ == 0) || (iVar21 - pjVar15->value_ != 2)) {
                    __assert_fail("leaf->known_ && i == leaf->value_ + 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                  ,0x116,
                                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                                 );
                  }
                }
                for (pjVar26 = pjVar28;
                    (pjVar26 != pjVar25->passes + pjVar25->numpasses && (pjVar26->lyrno == lyrno));
                    pjVar26 = pjVar26 + 1) {
                }
                iVar11 = (int)((long)pjVar26 - (long)pjVar28 >> 3) * 0x38e38e39;
                if (iVar11 < 1) {
                  return -1;
                }
                if (iVar11 == 2) {
                  uVar20 = 2;
                  iVar11 = 2;
LAB_0012fbe1:
                  iVar11 = jpc_bitstream_putbits(out_00,iVar11,uVar20);
                }
                else {
                  if (iVar11 != 1) {
                    if (iVar11 < 6) {
                      uVar20 = (ulong)(iVar11 - 3) | 0xc;
                      iVar11 = 4;
                    }
                    else if (iVar11 < 0x25) {
                      uVar20 = (ulong)(iVar11 - 6) | 0x1e0;
                      iVar11 = 9;
                    }
                    else {
                      if (0xa4 < iVar11) {
                        return -1;
                      }
                      uVar20 = (ulong)(iVar11 - 0x25) | 0xff80;
                      iVar11 = 0x10;
                    }
                    goto LAB_0012fbe1;
                  }
                  if ((out_00->openmode_ & 2) == 0) {
                    __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                  ,0x72,"int jpc_putnumnewpasses(jpc_bitstream_t *, int)");
                  }
                  iVar21 = out_00->cnt_;
                  out_00->cnt_ = iVar21 + -1;
                  iVar11 = 0;
                  if (iVar21 < 1) {
                    uVar20 = out_00->buf_;
                    pjVar23 = out_00->stream_;
                    uVar8 = uVar20 & 0xff;
                    out_00->buf_ = uVar8 << 8;
                    out_00->cnt_ = uVar8 == 0xff ^ 7;
                    iVar11 = -1;
                    if ((pjVar23->flags_ & 7U) == 0) {
                      if ((pjVar23->rwlimit_ < 0) || (pjVar23->rwcnt_ < pjVar23->rwlimit_)) {
                        *(byte *)&pjVar23->bufmode_ = (byte)pjVar23->bufmode_ | 0x20;
                        iVar11 = pjVar23->cnt_;
                        pjVar23->cnt_ = iVar11 + -1;
                        bVar9 = (byte)uVar20;
                        if (iVar11 < 1) {
                          iVar11 = jas_stream_flushbuf(pjVar23,(uint)bVar9);
                          iVar11 = -(uint)(iVar11 == -1);
                        }
                        else {
                          pjVar23->rwcnt_ = pjVar23->rwcnt_ + 1;
                          pbVar7 = pjVar23->ptr_;
                          pjVar23->ptr_ = pbVar7 + 1;
                          *pbVar7 = bVar9;
                          iVar11 = 0;
                        }
                      }
                      else {
                        pjVar23->flags_ = pjVar23->flags_ | 4;
                      }
                    }
                  }
                }
                if (iVar11 == -1) {
                  return -1;
                }
                if (9 < iVar10) {
                  jas_eprintf("numnewpasses=%d ");
                }
                if (pjVar28 == pjVar26) {
                  iVar11 = 0;
                }
                else {
                  iVar21 = pjVar28->start;
                  iVar11 = 0;
                  iVar13 = 1;
                  pjVar19 = pjVar28;
                  do {
                    if (pjVar19 == pjVar26 + -1 || pjVar19->term != 0) {
                      iVar14 = pjVar19->end;
                      iVar12 = jpc_int_firstone(iVar14 - iVar21);
                      iVar21 = pjVar25->numlenbits;
                      iVar13 = jpc_floorlog2(iVar13);
                      iVar21 = (iVar12 - (iVar13 + iVar21)) + 1;
                      if (iVar11 < iVar21) {
                        iVar11 = iVar21;
                      }
                      if (iVar11 < 1) {
                        iVar11 = 0;
                      }
                      iVar13 = 1;
                      iVar21 = iVar14;
                    }
                    else {
                      iVar13 = iVar13 + 1;
                    }
                    pjVar19 = pjVar19 + 1;
                  } while (pjVar19 != pjVar26);
                }
                if (iVar11 != 0) {
                  iVar21 = iVar11 + 1;
                  do {
                    if ((out_00->openmode_ & 2) == 0) {
                      __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                    ,0x61,"int jpc_putcommacode(jpc_bitstream_t *, int)");
                    }
                    iVar14 = out_00->cnt_;
                    iVar13 = iVar14 + -1;
                    out_00->cnt_ = iVar13;
                    if (iVar14 < 1) {
                      uVar20 = out_00->buf_;
                      pjVar23 = out_00->stream_;
                      uVar8 = uVar20 & 0xff;
                      uVar17 = uVar8 == 0xff ^ 7;
                      out_00->cnt_ = uVar17;
                      out_00->buf_ = (ulong)(uint)(1 << (sbyte)uVar17) | uVar8 << 8;
                      uVar17 = pjVar23->flags_;
                      if ((uVar17 & 7) != 0) {
                        return -1;
                      }
                      if ((-1 < pjVar23->rwlimit_) && (pjVar23->rwlimit_ <= pjVar23->rwcnt_))
                      goto LAB_001301fb;
                      *(byte *)&pjVar23->bufmode_ = (byte)pjVar23->bufmode_ | 0x20;
                      iVar13 = pjVar23->cnt_;
                      pjVar23->cnt_ = iVar13 + -1;
                      bVar9 = (byte)uVar20;
                      if (iVar13 < 1) {
                        iVar13 = jas_stream_flushbuf(pjVar23,(uint)bVar9);
                        if (iVar13 == -1) {
                          return -1;
                        }
                      }
                      else {
                        pjVar23->rwcnt_ = pjVar23->rwcnt_ + 1;
                        pbVar7 = pjVar23->ptr_;
                        pjVar23->ptr_ = pbVar7 + 1;
                        *pbVar7 = bVar9;
                      }
                    }
                    else {
                      out_00->buf_ = out_00->buf_ | (long)(1 << ((byte)iVar13 & 0x1f));
                    }
                    iVar21 = iVar21 + -1;
                  } while (1 < iVar21);
                }
                if ((out_00->openmode_ & 2) == 0) {
                  __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x65,"int jpc_putcommacode(jpc_bitstream_t *, int)");
                }
                iVar21 = out_00->cnt_;
                out_00->cnt_ = iVar21 + -1;
                if (iVar21 < 1) {
                  uVar20 = out_00->buf_;
                  pjVar23 = out_00->stream_;
                  uVar8 = uVar20 & 0xff;
                  out_00->buf_ = uVar8 << 8;
                  out_00->cnt_ = uVar8 == 0xff ^ 7;
                  if ((pjVar23->flags_ & 7U) != 0) {
                    return -1;
                  }
                  if ((-1 < pjVar23->rwlimit_) && (pjVar23->rwlimit_ <= pjVar23->rwcnt_)) {
                    pjVar23->flags_ = pjVar23->flags_ | 4;
                    return -1;
                  }
                  *(byte *)&pjVar23->bufmode_ = (byte)pjVar23->bufmode_ | 0x20;
                  iVar21 = pjVar23->cnt_;
                  pjVar23->cnt_ = iVar21 + -1;
                  bVar9 = (byte)uVar20;
                  if (iVar21 < 1) {
                    iVar21 = jas_stream_flushbuf(pjVar23,(uint)bVar9);
                    if (iVar21 == -1) {
                      return -1;
                    }
                  }
                  else {
                    pjVar23->rwcnt_ = pjVar23->rwcnt_ + 1;
                    pbVar7 = pjVar23->ptr_;
                    pjVar23->ptr_ = pbVar7 + 1;
                    *pbVar7 = bVar9;
                  }
                }
                pjVar25->numlenbits = pjVar25->numlenbits + iVar11;
                if (pjVar28 != pjVar26) {
                  iVar11 = pjVar28->start;
                  iVar21 = 1;
                  do {
                    if (pjVar28 == pjVar26 + -1 || pjVar28->term != 0) {
                      iVar13 = pjVar28->end;
                      iVar11 = iVar13 - iVar11;
                      iVar12 = jpc_int_firstone(iVar11);
                      iVar14 = pjVar25->numlenbits;
                      iVar21 = jpc_floorlog2(iVar21);
                      iVar21 = iVar21 + iVar14;
                      if (iVar21 <= iVar12) {
                        __assert_fail("jpc_int_firstone(datalen) < cblk->numlenbits + jpc_floorlog2(passcount)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                      ,0x142,
                                      "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                                     );
                      }
                      iVar14 = jpc_bitstream_putbits(out_00,iVar21,(long)iVar11);
                      iVar21 = 1;
                      iVar11 = iVar13;
                      if (iVar14 == -1) {
                        return -1;
                      }
                    }
                    else {
                      iVar21 = iVar21 + 1;
                    }
                    pjVar28 = pjVar28 + 1;
                  } while (pjVar28 != pjVar26);
                }
              }
              pjVar25 = pjVar25 + 1;
            } while (pjVar25 != pjVar27);
          }
        }
      }
      pjVar18 = pjVar18 + 1;
    } while (pjVar18 != pjVar22);
  }
  jpc_bitstream_outalign(out_00,0);
  jpc_bitstream_close(out_00);
  if (((pjVar1->tcp).csty & 4) != 0) {
    pjVar16 = jpc_ms_create(0xff92);
    if (pjVar16 == (jpc_ms_t *)0x0) {
      return -1;
    }
    iVar11 = jpc_putms(out,enc->cstate,pjVar16);
    if (iVar11 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar16);
  }
  pjVar3 = pjVar2->tcmpts[compno].rlvls;
  uVar20 = (ulong)pjVar3[lvlno].numbands;
  if (uVar20 != 0) {
    pjVar18 = pjVar3[lvlno].bands;
    pjVar22 = pjVar18 + uVar20;
    do {
      if (pjVar18->data != (jas_matrix_t *)0x0) {
        pjVar25 = pjVar18->prcs[prcno].cblks;
        if ((pjVar25 != (jpc_enc_cblk_t *)0x0) &&
           (uVar20 = (ulong)pjVar18->prcs[prcno].numcblks, uVar20 != 0)) {
          pjVar27 = pjVar25 + uVar20;
          do {
            pjVar28 = pjVar25->curpass;
            if (pjVar28 != (jpc_enc_pass_t *)0x0) {
              if (pjVar28->lyrno == lyrno) {
                bVar29 = pjVar28 == pjVar25->passes + pjVar25->numpasses;
                pjVar26 = pjVar28;
                if (!bVar29) {
                  uVar17 = pjVar28->lyrno;
                  pjVar19 = pjVar28;
                  while (pjVar26 = pjVar19, uVar17 == lyrno) {
                    pjVar26 = pjVar19 + 1;
                    bVar29 = pjVar26 == pjVar25->passes + pjVar25->numpasses;
                    if (bVar29) break;
                    uVar17 = pjVar19[1].lyrno;
                    pjVar19 = pjVar26;
                  }
                }
                jas_stream_seek(pjVar25->stream,(long)pjVar28->start,0);
                pjVar23 = pjVar25->stream;
                lVar24 = jas_stream_tell(pjVar23);
                if (lVar24 != pjVar28->start) {
                  __assert_fail("jas_stream_tell(cblk->stream) == startpass->start",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x17e,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar11 = jas_stream_copy(out,pjVar23,pjVar26[-1].end - pjVar28->start);
                if (iVar11 != 0) {
                  return -1;
                }
                pjVar19 = (jpc_enc_pass_t *)0x0;
                if (!bVar29) {
                  pjVar19 = pjVar26;
                }
                pjVar25->curpass = pjVar19;
                pjVar25->numencpasses =
                     pjVar25->numencpasses +
                     (int)((ulong)((long)pjVar26 - (long)pjVar28) >> 3) * 0x38e38e39;
              }
              else if (pjVar28->lyrno <= lyrno) {
                __assert_fail("pass->lyrno > lyrno",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                              ,0x170,
                              "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                             );
              }
            }
            pjVar25 = pjVar25 + 1;
          } while (pjVar25 != pjVar27);
        }
      }
      pjVar18 = pjVar18 + 1;
    } while (pjVar18 != pjVar22);
  }
  if (9 < iVar10) {
    jas_eprintf("encoding packet end\n");
  }
  return 0;
}

Assistant:

int jpc_enc_encpkt(jpc_enc_t *enc, jas_stream_t *out, int compno, int lvlno, int prcno, unsigned lyrno)
{
	jpc_enc_tcmpt_t *comp;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_bitstream_t *outb;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *startpass;
	jpc_enc_pass_t *lastpass;
	jpc_enc_pass_t *endpass;
	jpc_enc_pass_t *endpasses;
	int i;
	int included;
	int ret;
	jpc_tagtreenode_t *leaf;
	int n;
	int t1;
	int t2;
	int adjust;
	int maxadjust;
	int datalen;
	int numnewpasses;
	int passcount;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	jpc_enc_cp_t *cp;
	jpc_ms_t *ms;

	JAS_DBGLOG(10, ("encoding packet begin %d %d %d %d\n", compno, lvlno,
	  prcno, lyrno));

	tile = enc->curtile;
	cp = enc->cp;

	if (cp->tcp.csty & JPC_COD_SOP) {
		if (!(ms = jpc_ms_create(JPC_MS_SOP))) {
			return -1;
		}
		ms->parms.sop.seqno = jpc_pi_getind(tile->pi);
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	if (!(outb = jpc_bitstream_sopen(out, "w+"))) {
		abort();
	}

	if (jpc_bitstream_putbit(outb, 1) == EOF) {
		return -1;
	}
	//JAS_DBGLOG(10, ("\n"));
	JAS_DBGLOG(10, ("present.\n"));

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			if (!lyrno) {
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->nlibtree, leaf, cblk->numimsbs);
			}
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (included && (!cblk->numencpasses)) {
				assert(pass->lyrno == lyrno);
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->incltree, leaf, pass->lyrno);
			}
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (!cblk->numencpasses) {
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				if (jpc_tagtree_encode(prc->incltree, leaf, lyrno + 1, outb) <
				  0) {
					return -1;
				}
			} else {
				if (jpc_bitstream_putbit(outb, included) == EOF) {
					return -1;
				}
			}
			JAS_DBGLOG(10, ("included=%d ", included));
			if (!included) {
				continue;
			}
			if (!cblk->numencpasses) {
				i = 1;
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				for (;;) {
					if ((ret = jpc_tagtree_encode(prc->nlibtree, leaf, i,
					  outb)) < 0) {
						return -1;
					}
					if (ret) {
						break;
					}
					++i;
				}
				assert(leaf->known_ && i == leaf->value_ + 1);
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			numnewpasses = endpass - startpass;
			if (jpc_putnumnewpasses(outb, numnewpasses)) {
				return -1;
			}
			JAS_DBGLOG(10, ("numnewpasses=%d ", numnewpasses));

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			maxadjust = 0;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					t1 = jpc_int_firstone(datalen) + 1;
					t2 = cblk->numlenbits + jpc_floorlog2(passcount);
					adjust = JAS_MAX(t1 - t2, 0);
					maxadjust = JAS_MAX(adjust, maxadjust);
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
			if (jpc_putcommacode(outb, maxadjust)) {
				return -1;
			}
			cblk->numlenbits += maxadjust;

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					assert(jpc_int_firstone(datalen) < cblk->numlenbits +
					  jpc_floorlog2(passcount));
					if (jpc_bitstream_putbits(outb, cblk->numlenbits +
					  jpc_floorlog2(passcount), datalen) == EOF) {
						return -1;
					}
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
		}
	}

	jpc_bitstream_outalign(outb, 0);
	jpc_bitstream_close(outb);

	if (cp->tcp.csty & JPC_COD_EPH) {
		if (!(ms = jpc_ms_create(JPC_MS_EPH))) {
			return -1;
		}
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}
		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;

			if (!pass) {
				continue;
			}
			if (pass->lyrno != lyrno) {
				assert(pass->lyrno > lyrno);
				continue;
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			lastpass = endpass - 1;
			numnewpasses = endpass - startpass;

			jas_stream_seek(cblk->stream, startpass->start, SEEK_SET);
			assert(jas_stream_tell(cblk->stream) == startpass->start);
			if (jas_stream_copy(out, cblk->stream, lastpass->end -
			  startpass->start)) {
				return -1;
			}
			cblk->curpass = (endpass != endpasses) ? endpass : 0;
			cblk->numencpasses += numnewpasses;

		}
	}

	JAS_DBGLOG(10, ("encoding packet end\n"));

	return 0;
}